

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O3

TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U> * __thiscall
Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>::setConstant
          (TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U> *this,Scalar *value)

{
  ulong local_20;
  ulong local_18;
  Scalar local_10;
  
  local_20 = (this->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
             m_storage.m_rows;
  local_18 = (this->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
             m_storage.m_cols;
  local_10 = *value;
  if (-1 < (long)(local_18 | local_20)) {
    TriangularView<Eigen::Matrix<double,-1,-1,0,-1,-1>,10u>::
    lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>,10u> *)this,
               (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_20);
    return this;
  }
  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x3f,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

inline Index rows() const { return m_matrix.rows(); }